

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O0

void __thiscall QFileDialogPrivate::renameCurrent(QFileDialogPrivate *this)

{
  ViewMode VVar1;
  QAbstractItemView *this_00;
  QFileDialogPrivate *in_RDI;
  long in_FS_OFFSET;
  QFileDialog *q;
  QModelIndex index;
  QFileDialogPrivate *this_01;
  undefined1 *local_20;
  undefined1 *local_18;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  this_00 = (QAbstractItemView *)q_func(in_RDI);
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
            (&in_RDI->qFileDialogUi);
  QAbstractItemView::currentIndex((QAbstractItemView *)this_01);
  QModelIndex::row((QModelIndex *)&local_20);
  QModelIndex::sibling((QModelIndex *)this_01,(int)((ulong)this_00 >> 0x20),(int)this_00);
  VVar1 = QFileDialog::viewMode((QFileDialog *)this_00);
  if (VVar1 == List) {
    QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
              (&in_RDI->qFileDialogUi);
    QAbstractItemView::edit(this_00,(QModelIndex *)in_RDI);
  }
  else {
    QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
              (&in_RDI->qFileDialogUi);
    QAbstractItemView::edit(this_00,(QModelIndex *)in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileDialogPrivate::renameCurrent()
{
    Q_Q(QFileDialog);
    QModelIndex index = qFileDialogUi->listView->currentIndex();
    index = index.sibling(index.row(), 0);
    if (q->viewMode() == QFileDialog::List)
        qFileDialogUi->listView->edit(index);
    else
        qFileDialogUi->treeView->edit(index);
}